

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize_expr.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  uint64_t addr;
  ostream *poVar2;
  uint uVar3;
  initializer_list<nivalis::Expr::ASTNode> __l;
  initializer_list<nivalis::Expr::ASTNode> __l_00;
  initializer_list<nivalis::Expr::ASTNode> __l_01;
  initializer_list<nivalis::Expr::ASTNode> __l_02;
  initializer_list<nivalis::Expr::ASTNode> __l_03;
  initializer_list<nivalis::Expr::ASTNode> __l_04;
  initializer_list<nivalis::Expr::ASTNode> __l_05;
  initializer_list<nivalis::Expr::ASTNode> __l_06;
  initializer_list<nivalis::Expr::ASTNode> __l_07;
  initializer_list<nivalis::Expr::ASTNode> __l_08;
  initializer_list<nivalis::Expr::ASTNode> __l_09;
  initializer_list<nivalis::Expr::ASTNode> __l_10;
  initializer_list<nivalis::Expr::ASTNode> __l_11;
  initializer_list<nivalis::Expr::ASTNode> __l_12;
  initializer_list<nivalis::Expr::ASTNode> __l_13;
  initializer_list<nivalis::Expr::ASTNode> __l_14;
  initializer_list<nivalis::Expr::ASTNode> __l_15;
  ASTNode AVar4;
  allocator<char> local_d9;
  AST ty_2;
  ASTNode local_b8;
  uint32_t local_a8;
  anon_union_8_3_343d95dd_for_ASTNode_1 local_a0;
  ASTNode local_98;
  _Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_88;
  AST ty;
  AST ast_zero;
  AST ast_one;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"x",(allocator<char> *)&ast_zero);
  addr = nivalis::Environment::addr_of
                   ((Environment *)&(anonymous_namespace)::env,(string *)&ty_2,false);
  std::__cxx11::string::~string((string *)&ty_2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"nan",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"nan\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3b);
    std::operator<<(poVar2,"\n");
  }
  uVar3 = (uint)!bVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"2*-x*x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"2*-x*x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3d);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"2*(x*x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"2*(x*x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3e);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-(x*x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-(x*x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3f);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"0*x*1",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"0*x*1\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x40);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"+-1*(--+--x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"+-1*(--+--x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x41);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"0+1*x/1",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"0+1*x/1\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x42);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"x+x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"x+x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x43);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"x-x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"x-x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x44);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-x+2*x-1*x-0*x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-x+2*x-1*x-0*x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x45);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"x+2*x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"x+2*x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x46);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"9.5*-2*2*x/2*3*101",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"9.5*-2*2*x/2*3*101\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x47);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-2*x+3*x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-2*x+3*x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x48);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"3.2/(x+3)*x-3*x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"3.2/(x+3)*x-3*x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x49);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-29*a+3*a-5*a*x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,1,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-29*a+3*a-5*a*x\", 1)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4b);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-29*a+3*a-5*a",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,1,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-29*a+3*a-5*a\", 1)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4c);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-a^2+a^1-a^0",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,1,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-a^2+a^1-a^0\", 1)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4d);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"31*x^1+3*x-5e2*x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"31*x^1+3*x-5e2*x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4e);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-29*pi/2*x^0/2+3.5",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-29*pi/2*x^0/2+3.5\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4f);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-x^2*N(x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-x^2*N(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x50);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"abs(abs(abs(x)^2))",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"abs(abs(abs(x)^2))\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x51);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"e*x/x+x-x*x*x-x/2",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"e*x/x+x-x*x*x-x/2\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x52);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"3^x-3^(x*x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"3^x-3^(x*x)\", 0, -10.0, 10.0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x53);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"e^x-e^x^0.5",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"e^x-e^x^0.5\", 0, -10.0, 10.0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x54);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"2^x-2^(x*x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-5.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"2^x-2^(x*x)\", 0, -5.0, 10.0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x55);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"2*exp2(x^2)-exp2(x*x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-5.0,8.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_optim_equiv_random(\"2*exp2(x^2)-exp2(x*x)\", 0, -5.0, 8.0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x56);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"exp(2*x)+exp(x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"exp(2*x)+exp(x)\", 0, -10.0, 100.0)")
    ;
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x57);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"3*(exp(2*x)-exp(3*x))*2",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_optim_equiv_random(\"3*(exp(2*x)-exp(3*x))*2\", 0, -10.0, 100.0)"
                            );
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x59);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"9*log(x^2,2)*ln(x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,1e-10,200.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_optim_equiv_random(\"9*log(x^2,2)*ln(x)\", 0, 1e-10, 200.0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x5a);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"3%2%3%2%9%2%x",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"3%2%3%2%9%2%x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x5b);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"-fact(x+1)^1",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"-fact(x+1)^1\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x5c);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"{x<32.5: 9, 4}",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"{x<32.5: 9, 4}\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x5d);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"{x<32.5: x, x}",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"{x<32.5: x, x}\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x5e);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"{1: x, x^2}",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"{1: x, x^2}\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x5f);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"{0: x, 2*x^2}",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"{0: x, 2*x^2}\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x60);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"{x<3: {x<4:3}, {x<4:3}}",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"{x<3: {x<4:3}, {x<4:3}}\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x61);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"{x<0: {x<=3: 5}, 4}",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"{x<0: {x<=3: 5}, 4}\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x62);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"{x<0: abs(x)}",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"{x<0: abs(x)}\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,99);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"max(x,min(x^2,x))",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"max(x,min(x^2,x))\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,100);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"sum(x=0,a)[a*x^2]",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"sum(x=0,a)[a*x^2]\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x65);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"prod(x=1,3)[a*x^2]",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"prod(x=1,3)[a*x^2]\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x66);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"prod(x=1,3)[{x<2:a*x^2,3}]",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"prod(x=1,3)[{x<2:a*x^2,3}]\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x67);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"10*(sin(x)^2 + cos(x)^2)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"10*(sin(x)^2 + cos(x)^2)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x69);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"1/(2/x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"1/(2/x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x6a);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"3+1/(1/x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-100.0,100.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"3+1/(1/x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x6b);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"exp(log(x))",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,1e-10,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"exp(log(x))\", 0, 1e-10, 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x6c);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"2*pi^(ln(x))",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,1e-10,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"2*pi^(ln(x))\", 0, 1e-10, 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x6d);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"log2(exp2(x))",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"log2(exp2(x))\", 0, -10, 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x6e);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"log2(x^a)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"log2(x^a)\", 0, -10, 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x6f);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"exp(ln(abs(x)))",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"exp(ln(abs(x)))\", 0, -10, 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x70);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"3^(log(x,3))",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"3^(log(x,3))\", 0, -10., 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x71);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"exp(log(2^x))",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"exp(log(2^x))\", 0, -10., 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x72);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"2*2^(1+x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"2*2^(1+x)\", 0, -10., 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x73);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"2*exp2(1+2*x)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"2*exp2(1+2*x)\", 0, -10., 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x74);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"2^(diff(x)x^2)",(allocator<char> *)&ast_zero);
  bVar1 = anon_unknown.dwarf_4b66::test_optim_equiv_random((string *)&ty_2,0,-10.0,10.0);
  std::__cxx11::string::~string((string *)&ty_2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_optim_equiv_random(\"2^(diff(x)x^2)\", 0, -10., 10)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x75);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,0.0);
  __l._M_len = 1;
  __l._M_array = (ASTNode *)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ast_zero,__l,(allocator_type *)&ast_one);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,1.0);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ast_one,__l_00,(allocator_type *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"x+x",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,mul);
  nivalis::Expr::ASTNode::ASTNode
            ((ASTNode *)
             &ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,2.0);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  local_b8.field_1 = AVar4.field_1;
  local_b8.opcode = AVar4.opcode;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_01,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"x+x\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({mul, 2., Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x7a);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"exp(x)+3*exp(x)",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,mul);
  nivalis::Expr::ASTNode::ASTNode
            ((ASTNode *)
             &ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,4.0);
  nivalis::Expr::ASTNode::ASTNode(&local_b8,expb);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  local_a0 = AVar4.field_1;
  local_a8 = AVar4.opcode;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_02,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"exp(x)+3*exp(x)\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({mul, 4., expb, Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x7b);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"2*x-x",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)AVar4.field_1;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(ty.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,AVar4.opcode);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&ty;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty_2,__l_03,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty_2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"2*x-x\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty_2);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x7c);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>);
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"3*x^2-2*x^2-x^2",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty_2,&ast_zero);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty_2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"3*x^2-2*x^2-x^2\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"ast_zero");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty_2);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x7d);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>);
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"x*-3*x*x*2*x",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,mul);
  nivalis::Expr::ASTNode::ASTNode
            ((ASTNode *)
             &ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,-6.0);
  nivalis::Expr::ASTNode::ASTNode(&local_b8,power);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  local_a0 = AVar4.field_1;
  local_a8 = AVar4.opcode;
  nivalis::Expr::ASTNode::ASTNode(&local_98,4.0);
  __l_04._M_len = 5;
  __l_04._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_04,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"x*-3*x*x*2*x\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({mul, -6., power, Ref(x), 4.})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x7e);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ty_2,"sin(x)*sin(x) + cos(x)*cos(x)",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty_2,&ast_one);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty_2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"sin(x)*sin(x) + cos(x)*cos(x)\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"ast_one");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty_2);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x7f);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>);
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"---x",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,unaryminus);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty_2.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = AVar4.opcode;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_05,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"---x\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({unaryminus, Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x80);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"----x^2",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,sqrb);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty_2.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = AVar4.opcode;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_06,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"----x^2\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({sqrb, Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x81);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"3*3/4*x/3*4",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,mul);
  nivalis::Expr::ASTNode::ASTNode
            ((ASTNode *)
             &ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,3.0);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  local_b8.field_1 = AVar4.field_1;
  local_b8.opcode = AVar4.opcode;
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_07,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"3*3/4*x/3*4\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({mul, 3., Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x82);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"x^2/x",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)AVar4.field_1;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(ty.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,AVar4.opcode);
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&ty;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty_2,__l_08,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty_2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"x^2/x\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty_2);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x83);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>);
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"x^1.5*x^0.2",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,power);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty_2.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = AVar4.opcode;
  nivalis::Expr::ASTNode::ASTNode(&local_b8,1.7);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_09,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"x^1.5*x^0.2\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({power, Ref(x), 1.7})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x84);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"2^x",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,exp2b);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty_2.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = AVar4.opcode;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_10,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"2^x\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({exp2b, Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x85);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"log(x,10)",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,log10b);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty_2.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = AVar4.opcode;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_11,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"log(x,10)\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({log10b, Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x86);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"exp(x)*exp(2*x)",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,expb);
  nivalis::Expr::ASTNode::ASTNode
            ((ASTNode *)
             &ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,mul);
  nivalis::Expr::ASTNode::ASTNode(&local_b8,3.0);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  local_a0 = AVar4.field_1;
  local_a8 = AVar4.opcode;
  __l_12._M_len = 4;
  __l_12._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_12,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"exp(x)*exp(2*x)\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({expb, mul, 3., Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x87);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"exp(x)/exp(2*x)",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,expb);
  nivalis::Expr::ASTNode::ASTNode
            ((ASTNode *)
             &ty_2.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,unaryminus);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  local_b8.field_1 = AVar4.field_1;
  local_b8.opcode = AVar4.opcode;
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_13,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"exp(x)/exp(2*x)\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({expb, unaryminus, Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x88);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"exp(log(2^x))",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,exp2b);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty_2.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = AVar4.opcode;
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_14,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"exp(log(2^x))\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({exp2b, Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x89);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ty_2,"log(exp(sgn(x)))",&local_d9);
  anon_unknown.dwarf_4b66::optim((Expr *)&ty,(string *)&ty_2);
  local_88._M_impl.super__Vector_impl_data._M_start =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::__cxx11::string::~string((string *)&ty_2);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&ty_2,sgn);
  AVar4 = nivalis::test::anon_unknown_0::Ref(addr);
  ty_2.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = AVar4.opcode;
  __l_15._M_len = 2;
  __l_15._M_array = (iterator)&ty_2;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&ty,__l_15,(allocator_type *)&local_d9);
  bVar1 = std::operator!=((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )&local_88,&ty);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: ");
    poVar2 = std::operator<<(poVar2,"optim(\"log(exp(sgn(x)))\").ast");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"AST({sgn, Ref(x)})");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = operator<<(poVar2,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_88);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = operator<<(poVar2,&ty);
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x8a);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ty.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            );
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_88);
  if (uVar3 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"test_optimize_expr");
    std::operator<<(poVar2,": all passed\n");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"test_optimize_expr");
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,uVar3);
    std::operator<<(poVar2," asserts FAILED\n");
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ast_one.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>);
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&ast_zero.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>);
  return (uint)(uVar3 != 0);
}

Assistant:

int main() {
    BEGIN_TEST(test_optimize_expr);

    auto x = env.addr_of("x", false);

    // Correctness
    ASSERT(test_optim_equiv_random("nan", 0));

    ASSERT(test_optim_equiv_random("2*-x*x", 0));
    ASSERT(test_optim_equiv_random("2*(x*x)", 0));
    ASSERT(test_optim_equiv_random("-(x*x)", 0));
    ASSERT(test_optim_equiv_random("0*x*1", 0));
    ASSERT(test_optim_equiv_random("+-1*(--+--x)", 0));
    ASSERT(test_optim_equiv_random("0+1*x/1", 0));
    ASSERT(test_optim_equiv_random("x+x", 0));
    ASSERT(test_optim_equiv_random("x-x", 0));
    ASSERT(test_optim_equiv_random("-x+2*x-1*x-0*x", 0));
    ASSERT(test_optim_equiv_random("x+2*x", 0));
    ASSERT(test_optim_equiv_random("9.5*-2*2*x/2*3*101", 0));
    ASSERT(test_optim_equiv_random("-2*x+3*x", 0));
    ASSERT(test_optim_equiv_random("3.2/(x+3)*x-3*x", 0));

    ASSERT(test_optim_equiv_random("-29*a+3*a-5*a*x", 1));
    ASSERT(test_optim_equiv_random("-29*a+3*a-5*a", 1));
    ASSERT(test_optim_equiv_random("-a^2+a^1-a^0", 1));
    ASSERT(test_optim_equiv_random("31*x^1+3*x-5e2*x", 0));
    ASSERT(test_optim_equiv_random("-29*pi/2*x^0/2+3.5", 0));
    ASSERT(test_optim_equiv_random("-x^2*N(x)", 0));
    ASSERT(test_optim_equiv_random("abs(abs(abs(x)^2))", 0));
    ASSERT(test_optim_equiv_random("e*x/x+x-x*x*x-x/2", 0));
    ASSERT(test_optim_equiv_random("3^x-3^(x*x)", 0, -10.0, 10.0));
    ASSERT(test_optim_equiv_random("e^x-e^x^0.5", 0, -10.0, 10.0));
    ASSERT(test_optim_equiv_random("2^x-2^(x*x)", 0, -5.0, 10.0));
    ASSERT(test_optim_equiv_random("2*exp2(x^2)-exp2(x*x)", 0, -5.0, 8.0));
    ASSERT(test_optim_equiv_random("exp(2*x)+exp(x)", 0, -10.0, 100.0));
    ASSERT(test_optim_equiv_random("3*(exp(2*x)-exp(3*x))*2",
                0, -10.0, 100.0));
    ASSERT(test_optim_equiv_random("9*log(x^2,2)*ln(x)", 0, 1e-10, 200.0));
    ASSERT(test_optim_equiv_random("3%2%3%2%9%2%x", 0));
    ASSERT(test_optim_equiv_random("-fact(x+1)^1", 0));
    ASSERT(test_optim_equiv_random("{x<32.5: 9, 4}", 0));
    ASSERT(test_optim_equiv_random("{x<32.5: x, x}", 0));
    ASSERT(test_optim_equiv_random("{1: x, x^2}", 0));
    ASSERT(test_optim_equiv_random("{0: x, 2*x^2}", 0));
    ASSERT(test_optim_equiv_random("{x<3: {x<4:3}, {x<4:3}}", 0));
    ASSERT(test_optim_equiv_random("{x<0: {x<=3: 5}, 4}", 0));
    ASSERT(test_optim_equiv_random("{x<0: abs(x)}", 0));
    ASSERT(test_optim_equiv_random("max(x,min(x^2,x))", 0));
    ASSERT(test_optim_equiv_random("sum(x=0,a)[a*x^2]", 0));
    ASSERT(test_optim_equiv_random("prod(x=1,3)[a*x^2]", 0));
    ASSERT(test_optim_equiv_random("prod(x=1,3)[{x<2:a*x^2,3}]", 0));

    ASSERT(test_optim_equiv_random("10*(sin(x)^2 + cos(x)^2)", 0));
    ASSERT(test_optim_equiv_random("1/(2/x)", 0));
    ASSERT(test_optim_equiv_random("3+1/(1/x)", 0));
    ASSERT(test_optim_equiv_random("exp(log(x))", 0, 1e-10, 10));
    ASSERT(test_optim_equiv_random("2*pi^(ln(x))", 0, 1e-10, 10));
    ASSERT(test_optim_equiv_random("log2(exp2(x))", 0, -10, 10));
    ASSERT(test_optim_equiv_random("log2(x^a)", 0, -10, 10));
    ASSERT(test_optim_equiv_random("exp(ln(abs(x)))", 0, -10, 10));
    ASSERT(test_optim_equiv_random("3^(log(x,3))", 0, -10., 10));
    ASSERT(test_optim_equiv_random("exp(log(2^x))", 0, -10., 10));
    ASSERT(test_optim_equiv_random("2*2^(1+x)", 0, -10., 10));
    ASSERT(test_optim_equiv_random("2*exp2(1+2*x)", 0, -10., 10));
    ASSERT(test_optim_equiv_random("2^(diff(x)x^2)", 0, -10., 10));

    using namespace OpCode;
    AST ast_zero = {0.}, ast_one = {1.};
    // Basic competence
    ASSERT_EQ(optim("x+x").ast, AST({mul, 2., Ref(x)}));
    ASSERT_EQ(optim("exp(x)+3*exp(x)").ast, AST({mul, 4., expb, Ref(x)}));
    ASSERT_EQ(optim("2*x-x").ast, AST({Ref(x)}));
    ASSERT_EQ(optim("3*x^2-2*x^2-x^2").ast, ast_zero);
    ASSERT_EQ(optim("x*-3*x*x*2*x").ast, AST({mul, -6., power, Ref(x), 4.}));
    ASSERT_EQ(optim("sin(x)*sin(x) + cos(x)*cos(x)").ast, ast_one);
    ASSERT_EQ(optim("---x").ast, AST({unaryminus, Ref(x)}));
    ASSERT_EQ(optim("----x^2").ast, AST({sqrb, Ref(x)}));
    ASSERT_EQ(optim("3*3/4*x/3*4").ast, AST({mul, 3., Ref(x)}));
    ASSERT_EQ(optim("x^2/x").ast, AST({Ref(x)}));
    ASSERT_EQ(optim("x^1.5*x^0.2").ast, AST({power, Ref(x), 1.7}));
    ASSERT_EQ(optim("2^x").ast, AST({exp2b, Ref(x)}));
    ASSERT_EQ(optim("log(x,10)").ast, AST({log10b, Ref(x)}));
    ASSERT_EQ(optim("exp(x)*exp(2*x)").ast, AST({expb, mul, 3., Ref(x)}));
    ASSERT_EQ(optim("exp(x)/exp(2*x)").ast, AST({expb, unaryminus, Ref(x)}));
    ASSERT_EQ(optim("exp(log(2^x))").ast, AST({exp2b, Ref(x)}));
    ASSERT_EQ(optim("log(exp(sgn(x)))").ast, AST({sgn, Ref(x)}));

    END_TEST;
}